

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr c4::yml::anon_unknown_0::_transform_tag(Tree *t,csubstr tag,size_t node)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  size_t in_RDX;
  char *in_RSI;
  long in_RDI;
  csubstr cVar4;
  char msg_1 [45];
  size_t actual_size;
  char msg [45];
  substr buf;
  char *prev_arena;
  size_t required_size;
  size_t in_stack_000003e0;
  Tree *in_stack_000003e8;
  csubstr in_stack_000003f0;
  substr in_stack_00000400;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  char *in_stack_fffffffffffffdf8;
  Tree *in_stack_fffffffffffffe00;
  basic_substring<char> *this;
  undefined4 uStack_188;
  undefined4 uStack_184;
  char *local_180;
  undefined1 local_178 [48];
  char *local_148;
  size_t local_140;
  char *local_138;
  size_t local_130;
  basic_substring<char> *local_128;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  char *local_100;
  undefined1 local_f8 [56];
  substr local_c0;
  substr local_b0;
  substr local_a0;
  char *local_90;
  char *local_88;
  size_t local_80;
  basic_substring<char> local_78;
  basic_substring<char> *local_68;
  long local_58;
  char *local_50;
  size_t local_48;
  ro_substr local_40;
  char *local_30;
  undefined4 local_28;
  basic_substring<char> *local_20;
  substr *local_18;
  
  local_58 = in_RDI;
  local_50 = in_RSI;
  local_48 = in_RDX;
  basic_substring<char>::basic_substring(&local_78);
  local_88 = local_50;
  local_80 = local_48;
  local_68 = (basic_substring<char> *)
             Tree::resolve_tag(in_stack_000003e8,in_stack_00000400,in_stack_000003f0,
                               in_stack_000003e0);
  if (local_68 == (basic_substring<char> *)0x0) {
    local_40.len = local_48;
    local_40.str = local_50;
  }
  else {
    local_a0 = Tree::arena(in_stack_fffffffffffffe00);
    local_90 = local_a0.str;
    local_b0 = Tree::alloc_arena(in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8);
    local_c0 = Tree::arena(in_stack_fffffffffffffe00);
    if (local_c0.str != local_90) {
      memcpy(local_f8,"check failed: (t->arena().str == prev_arena)",0x2d);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      pcVar1 = *(code **)(local_58 + 0x58);
      Location::Location((Location *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                         CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                         CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                         CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      (*pcVar1)(local_f8,0x2d,*(undefined8 *)(local_58 + 0x40));
      in_stack_fffffffffffffde0 = uStack_118;
      in_stack_fffffffffffffde4 = uStack_114;
      in_stack_fffffffffffffde8 = local_110;
      in_stack_fffffffffffffdec = uStack_10c;
      in_stack_fffffffffffffdf0 = uStack_108;
      in_stack_fffffffffffffdf4 = uStack_104;
      in_stack_fffffffffffffdf8 = local_100;
    }
    local_138 = local_b0.str;
    local_130 = local_b0.len;
    local_148 = local_50;
    local_140 = local_48;
    local_128 = (basic_substring<char> *)
                Tree::resolve_tag(in_stack_000003e8,in_stack_00000400,in_stack_000003f0,
                                  in_stack_000003e0);
    if (local_68 < local_128) {
      memcpy(local_178,"check failed: (actual_size <= required_size)",0x2d);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      pcVar1 = *(code **)(local_58 + 0x58);
      Location::Location((Location *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                         CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                         CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                         CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      (*pcVar1)(local_178,0x2d,*(undefined8 *)(local_58 + 0x40));
      in_stack_fffffffffffffdf0 = uStack_188;
      in_stack_fffffffffffffdf4 = uStack_184;
      in_stack_fffffffffffffdf8 = local_180;
    }
    local_18 = &local_b0;
    local_20 = local_128;
    if (local_b0.len < local_128 && local_128 != (basic_substring<char> *)0xffffffffffffffff) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      local_30 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_28 = 0x154e;
      handle_error(0x3fa1ef,(char *)0x154e,"check failed: %s","num <= len || num == npos");
    }
    this = local_20;
    if (local_20 == (basic_substring<char> *)0xffffffffffffffff) {
      this = (basic_substring<char> *)local_b0.len;
    }
    basic_substring<char>::basic_substring
              (this,in_stack_fffffffffffffdf8,
               CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    local_40 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x3d2398);
  }
  cVar4.str = local_40.str;
  cVar4.len = local_40.len;
  return cVar4;
}

Assistant:

csubstr _transform_tag(Tree *t, csubstr tag, size_t node)
{
    size_t required_size = t->resolve_tag(substr{}, tag, node);
    if(!required_size)
        return tag;
    const char *prev_arena = t->arena().str;
    substr buf = t->alloc_arena(required_size);
    _RYML_CB_ASSERT(t->m_callbacks, t->arena().str == prev_arena);
    size_t actual_size = t->resolve_tag(buf, tag, node);
    _RYML_CB_ASSERT(t->m_callbacks, actual_size <= required_size);
    return buf.first(actual_size);
}